

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

void Str_MuxChangeOnce(Str_Mux_t *pTree,int *pPath,int i,int k,Str_Mux_t *pBackup,Gia_Man_t *pNew,
                      Vec_Int_t *vDelay)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  Str_Mux_t *pSVar10;
  uint local_74;
  int fCompl;
  int iCond;
  int iRes;
  int c;
  int MidCop;
  int MidDel;
  int MidCom;
  int MidFan;
  int pInds [3];
  Str_Mux_t *pSpots [3];
  Gia_Man_t *pNew_local;
  Str_Mux_t *pBackup_local;
  int k_local;
  int i_local;
  int *pPath_local;
  Str_Mux_t *pTree_local;
  
  if (k <= i + 1) {
    __assert_fail("i + 1 < k",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                  ,0x609,
                  "void Str_MuxChangeOnce(Str_Mux_t *, int *, int, int, Str_Mux_t *, Gia_Man_t *, Vec_Int_t *)"
                 );
  }
  if (pBackup != (Str_Mux_t *)0x0) {
    iVar3 = Abc_Lit2Var(pPath[k]);
    memcpy(pBackup,pTree + iVar3,0x40);
    iVar3 = Abc_Lit2Var(pPath[i + 1]);
    memcpy(pBackup + 1,pTree + iVar3,0x40);
    iVar3 = Abc_Lit2Var(pPath[i]);
    memcpy(pBackup + 2,pTree + iVar3,0x40);
  }
  iVar3 = Abc_Lit2Var(pPath[k]);
  iVar4 = Abc_Lit2Var(pPath[i + 1]);
  iVar5 = Abc_Lit2Var(pPath[i]);
  pSVar10 = pTree + iVar5;
  iVar5 = Abc_LitIsCompl(pPath[k]);
  iVar6 = Abc_LitIsCompl(pPath[i + 1]);
  iVar7 = Abc_LitIsCompl(pPath[i]);
  if (pTree[iVar3].Edge[iVar5].Fan < 1) {
    __assert_fail("pSpots[0]->Edge[pInds[0]].Fan > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                  ,0x618,
                  "void Str_MuxChangeOnce(Str_Mux_t *, int *, int, int, Str_Mux_t *, Gia_Man_t *, Vec_Int_t *)"
                 );
  }
  if (pTree[iVar4].Edge[iVar6].Fan < 1) {
    __assert_fail("pSpots[1]->Edge[pInds[1]].Fan > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                  ,0x619,
                  "void Str_MuxChangeOnce(Str_Mux_t *, int *, int, int, Str_Mux_t *, Gia_Man_t *, Vec_Int_t *)"
                 );
  }
  local_74 = 0;
  for (iCond = i + 1; iCond < k; iCond = iCond + 1) {
    iVar8 = Abc_Lit2Var(pPath[iCond]);
    iVar9 = Abc_LitIsCompl(pPath[iCond]);
    local_74 = pTree[iVar8].Edge[iVar9].fCompl ^ local_74;
  }
  iVar8 = pSVar10->Edge[(int)(uint)((iVar7 != 0 ^ 0xffU) & 1)].Fan;
  uVar1 = pSVar10->Edge[(int)(uint)((iVar7 != 0 ^ 0xffU) & 1)].fCompl;
  iVar9 = pSVar10->Edge[(int)(uint)((iVar7 != 0 ^ 0xffU) & 1)].FanDel;
  iVar2 = pSVar10->Edge[(int)(uint)((iVar7 != 0 ^ 0xffU) & 1)].Copy;
  pSVar10->Edge[(int)(uint)((iVar7 != 0 ^ 0xffU) & 1)].Fan = pTree[iVar3].Edge[iVar5].Fan;
  pSVar10->Edge[(int)(uint)((iVar7 != 0 ^ 0xffU) & 1)].fCompl = 0;
  pTree[iVar3].Edge[iVar5].Fan = pSVar10->Id;
  pTree[iVar4].Edge[iVar6].Fan = iVar8;
  pTree[iVar4].Edge[iVar6].fCompl = uVar1 ^ pTree[iVar4].Edge[iVar6].fCompl;
  pTree[iVar4].Edge[iVar6].FanDel = iVar9;
  pTree[iVar4].Edge[iVar6].Copy = iVar2;
  for (iCond = i + 1; iCond < k; iCond = iCond + 1) {
    iVar3 = pSVar10->Edge[2].FanDel;
    iVar4 = Abc_Lit2Var(pPath[iCond]);
    iVar3 = Str_Delay2(iVar3,pTree[iVar4].Edge[2].FanDel,pTree->nLutSize);
    pSVar10->Edge[2].FanDel = iVar3;
  }
  if (pNew != (Gia_Man_t *)0x0) {
    fCompl = 1;
    for (iCond = i; iCond < k; iCond = iCond + 1) {
      iVar3 = Abc_Lit2Var(pPath[iCond]);
      if (pTree[iVar3].Edge[2].fCompl != 0) {
        __assert_fail("pTree[Abc_Lit2Var(pPath[c])].Edge[2].fCompl == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                      ,0x636,
                      "void Str_MuxChangeOnce(Str_Mux_t *, int *, int, int, Str_Mux_t *, Gia_Man_t *, Vec_Int_t *)"
                     );
      }
      iVar3 = Abc_Lit2Var(pPath[iCond]);
      iVar3 = pTree[iVar3].Edge[2].Copy;
      iVar4 = Abc_LitIsCompl(pPath[iCond]);
      iVar3 = Abc_LitNotCond(iVar3,(uint)((iVar4 != 0 ^ 0xffU) & 1));
      fCompl = Gia_ManHashAnd(pNew,fCompl,iVar3);
      iVar3 = Abc_Lit2Var(fCompl);
      Str_ObjDelay(pNew,iVar3,pTree->nLutSize,vDelay);
    }
    iVar3 = Abc_LitIsCompl(pPath[i]);
    iVar3 = Abc_LitNotCond(fCompl,(uint)((iVar3 != 0 ^ 0xffU) & 1));
    pSVar10->Edge[2].Copy = iVar3;
    pSVar10->Edge[iVar7].fCompl = local_74 ^ pSVar10->Edge[iVar7].fCompl;
  }
  return;
}

Assistant:

void Str_MuxChangeOnce( Str_Mux_t * pTree, int * pPath, int i, int k, Str_Mux_t * pBackup, Gia_Man_t * pNew, Vec_Int_t * vDelay )
{
    Str_Mux_t * pSpots[3];
    int pInds[3], MidFan, MidCom, MidDel, MidCop, c;
    int iRes, iCond, fCompl;
    // save backup
    assert( i + 1 < k );
    if ( pBackup )
    {
        pBackup[0] = pTree[ Abc_Lit2Var(pPath[k])  ];
        pBackup[1] = pTree[ Abc_Lit2Var(pPath[i+1])];
        pBackup[2] = pTree[ Abc_Lit2Var(pPath[i])  ];
    }
    // perform changes
    pSpots[0] = pTree + Abc_Lit2Var(pPath[k]); 
    pSpots[1] = pTree + Abc_Lit2Var(pPath[i+1]); 
    pSpots[2] = pTree + Abc_Lit2Var(pPath[i]); 
    pInds[0] = Abc_LitIsCompl(pPath[k]);
    pInds[1] = Abc_LitIsCompl(pPath[i+1]);
    pInds[2] = Abc_LitIsCompl(pPath[i]);
    // check
    assert( pSpots[0]->Edge[pInds[0]].Fan > 0 );
    assert( pSpots[1]->Edge[pInds[1]].Fan > 0 );
    // collect complement
    fCompl = 0;
    for ( c = i+1; c < k; c++ )
        fCompl ^= pTree[Abc_Lit2Var(pPath[c])].Edge[Abc_LitIsCompl(pPath[c])].fCompl;
    // remember bottom side
    MidFan = pSpots[2]->Edge[!pInds[2]].Fan;
    MidCom = pSpots[2]->Edge[!pInds[2]].fCompl;
    MidDel = pSpots[2]->Edge[!pInds[2]].FanDel;
    MidCop = pSpots[2]->Edge[!pInds[2]].Copy;
    // update bottom
    pSpots[2]->Edge[!pInds[2]].Fan    = pSpots[0]->Edge[pInds[0]].Fan;
    pSpots[2]->Edge[!pInds[2]].fCompl = 0;
    // update top 
    pSpots[0]->Edge[pInds[0]].Fan     = pSpots[2]->Id;
    // update middle
    pSpots[1]->Edge[pInds[1]].Fan     = MidFan;
    pSpots[1]->Edge[pInds[1]].fCompl ^= MidCom;
    pSpots[1]->Edge[pInds[1]].FanDel  = MidDel;
    pSpots[1]->Edge[pInds[1]].Copy    = MidCop;
    // update delay of the control
    for ( c = i + 1; c < k; c++ )
        pSpots[2]->Edge[2].FanDel = Str_Delay2( pSpots[2]->Edge[2].FanDel, pTree[Abc_Lit2Var(pPath[c])].Edge[2].FanDel, pTree->nLutSize );
    if ( pNew == NULL )
        return;
    // create AND gates
    iRes = 1;
    for ( c = i; c < k; c++ )
    {
        assert( pTree[Abc_Lit2Var(pPath[c])].Edge[2].fCompl == 0 );
        iCond = pTree[Abc_Lit2Var(pPath[c])].Edge[2].Copy;
        iCond = Abc_LitNotCond( iCond, !Abc_LitIsCompl(pPath[c]) );
        iRes  = Gia_ManHashAnd( pNew, iRes, iCond );
        Str_ObjDelay( pNew, Abc_Lit2Var(iRes), pTree->nLutSize, vDelay );
    }
    // complement the condition
    pSpots[2]->Edge[2].Copy = Abc_LitNotCond( iRes, !Abc_LitIsCompl(pPath[i]) );
    // complement the path
    pSpots[2]->Edge[pInds[2]].fCompl ^= fCompl;
}